

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O0

void __thiscall QTreeViewPrivate::clearConnections(QTreeViewPrivate *this)

{
  iterator pvVar1;
  iterator pvVar2;
  long in_RDI;
  Connection *connection_1;
  iterator __end1_1;
  iterator __begin1_1;
  array<QMetaObject::Connection,_5UL> *__range1_1;
  Connection *connection;
  iterator __end1;
  iterator __begin1;
  array<QMetaObject::Connection,_2UL> *__range1;
  Connection *local_38;
  Connection *local_18;
  
  local_18 = std::array<QMetaObject::Connection,_2UL>::begin
                       ((array<QMetaObject::Connection,_2UL> *)0x8ee4cb);
  pvVar1 = std::array<QMetaObject::Connection,_2UL>::end
                     ((array<QMetaObject::Connection,_2UL> *)0x8ee4da);
  for (; local_18 != pvVar1; local_18 = local_18 + 1) {
    QObject::disconnect(local_18);
  }
  local_38 = std::array<QMetaObject::Connection,_5UL>::begin
                       ((array<QMetaObject::Connection,_5UL> *)0x8ee547);
  pvVar2 = std::array<QMetaObject::Connection,_5UL>::end
                     ((array<QMetaObject::Connection,_5UL> *)0x8ee556);
  for (; local_38 != pvVar2; local_38 = local_38 + 1) {
    QObject::disconnect(local_38);
  }
  QObject::disconnect((Connection *)(in_RDI + 0x638));
  QObject::disconnect((Connection *)(in_RDI + 0x678));
  QObject::disconnect((Connection *)(in_RDI + 0x630));
  return;
}

Assistant:

void QTreeViewPrivate::clearConnections()
{
    for (const QMetaObject::Connection &connection : modelConnections)
        QObject::disconnect(connection);
    for (const QMetaObject::Connection &connection : headerConnections)
        QObject::disconnect(connection);
    QObject::disconnect(selectionmodelConnection);
    QObject::disconnect(sortHeaderConnection);
#if QT_CONFIG(animation)
    QObject::disconnect(animationConnection);
#endif
}